

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O0

void __thiscall cppjieba::DictTrie::LoadUserDict(DictTrie *this,string *filePaths)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  size_type sVar4;
  undefined8 uVar5;
  ostream *poVar6;
  reference pvVar7;
  istream *piVar8;
  long lVar9;
  Logger *in_RSI;
  string line;
  ifstream ifs;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  ostream *in_stack_fffffffffffffbb0;
  size_t in_stack_fffffffffffffbb8;
  string *in_stack_fffffffffffffbc0;
  undefined7 in_stack_fffffffffffffbc8;
  undefined1 in_stack_fffffffffffffbcf;
  string local_410 [108];
  int in_stack_fffffffffffffc5c;
  char *in_stack_fffffffffffffc60;
  size_t in_stack_fffffffffffffc68;
  Logger *in_stack_fffffffffffffc70;
  string *in_stack_fffffffffffffd28;
  DictTrie *in_stack_fffffffffffffd30;
  istream local_270 [520];
  ulong local_68;
  allocator local_49;
  string local_48 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"|;",&local_49);
  limonp::Split((string *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
                in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  for (local_68 = 0; uVar1 = local_68,
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_28), uVar1 < sVar4; local_68 = local_68 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_28,local_68);
    uVar5 = std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_270,uVar5,8);
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
      limonp::Logger::Logger
                (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
                 in_stack_fffffffffffffc5c);
      poVar6 = limonp::Logger::Stream((Logger *)(local_410 + 0x20));
      poVar6 = std::operator<<(poVar6,"exp: [ifs.is_open()");
      poVar6 = std::operator<<(poVar6,"] false. ");
      in_stack_fffffffffffffbb0 = std::operator<<(poVar6,"open ");
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_28,local_68);
      poVar6 = std::operator<<(in_stack_fffffffffffffbb0,(string *)pvVar7);
      std::operator<<(poVar6," failed");
      limonp::Logger::~Logger(in_RSI);
    }
    std::__cxx11::string::string(local_410);
    while( true ) {
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_270,local_410);
      bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
      if (!bVar3) break;
      lVar9 = std::__cxx11::string::size();
      if (lVar9 != 0) {
        InserUserDictNode(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      }
    }
    std::__cxx11::string::~string(local_410);
    std::ifstream::~ifstream(local_270);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffbb0);
  return;
}

Assistant:

void LoadUserDict(const std::string& filePaths) {
    std::vector<std::string> files = limonp::Split(filePaths, "|;");
    for (size_t i = 0; i < files.size(); i++) {
      std::ifstream ifs(files[i].c_str());
      XCHECK(ifs.is_open()) << "open " << files[i] << " failed";
      std::string line;

      while(getline(ifs, line)) {
        if (line.size() == 0) {
          continue;
        }
        InserUserDictNode(line);
      }
    }
  }